

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O2

void switch_v7m_security_state(CPUARMState_conflict *env,_Bool new_secstate)

{
  uint uVar1;
  uint32_t uVar2;
  anon_struct_184_29_b29170fc_for_v7m *paVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined3 in_register_00000031;
  uint uVar6;
  anon_struct_184_29_b29170fc_for_v7m *paVar7;
  
  uVar6 = CONCAT31(in_register_00000031,new_secstate);
  uVar1 = (env->v7m).secure;
  if (uVar1 == uVar6) {
    return;
  }
  uVar2 = (env->v7m).other_ss_msp;
  uVar5 = (env->v7m).other_ss_psp;
  if ((env->v7m).exception == 0) {
    paVar7 = &env->v7m;
    paVar3 = (anon_struct_184_29_b29170fc_for_v7m *)(env->regs + 0xd);
    if (((env->v7m).control[uVar1] & 2) == 0) {
      paVar7 = (anon_struct_184_29_b29170fc_for_v7m *)(env->regs + 0xd);
      paVar3 = &env->v7m;
    }
    uVar4 = paVar3->other_sp;
    (env->v7m).other_ss_msp = paVar7->other_sp;
    (env->v7m).other_ss_psp = uVar4;
    (env->v7m).secure = uVar6;
    uVar4 = uVar2;
    if (((env->v7m).control[new_secstate] & 2) != 0) goto LAB_005b5b8a;
  }
  else {
    (env->v7m).other_ss_msp = env->regs[0xd];
    (env->v7m).other_ss_psp = (env->v7m).other_sp;
    (env->v7m).secure = uVar6;
  }
  uVar4 = uVar5;
  uVar5 = uVar2;
LAB_005b5b8a:
  env->regs[0xd] = uVar5;
  (env->v7m).other_sp = uVar4;
  return;
}

Assistant:

static void switch_v7m_security_state(CPUARMState *env, bool new_secstate)
{
    uint32_t new_ss_msp, new_ss_psp;

    if (env->v7m.secure == new_secstate) {
        return;
    }

    /*
     * All the banked state is accessed by looking at env->v7m.secure
     * except for the stack pointer; rearrange the SP appropriately.
     */
    new_ss_msp = env->v7m.other_ss_msp;
    new_ss_psp = env->v7m.other_ss_psp;

    if (v7m_using_psp(env)) {
        env->v7m.other_ss_psp = env->regs[13];
        env->v7m.other_ss_msp = env->v7m.other_sp;
    } else {
        env->v7m.other_ss_msp = env->regs[13];
        env->v7m.other_ss_psp = env->v7m.other_sp;
    }

    env->v7m.secure = new_secstate;

    if (v7m_using_psp(env)) {
        env->regs[13] = new_ss_psp;
        env->v7m.other_sp = new_ss_msp;
    } else {
        env->regs[13] = new_ss_msp;
        env->v7m.other_sp = new_ss_psp;
    }
}